

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_32x8_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ushort uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  longlong lVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  longlong lVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  undefined1 (*pauVar69) [16];
  undefined1 (*pauVar70) [16];
  longlong *plVar71;
  long lVar72;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  int i_3;
  int i_2;
  __m128i d [32];
  __m128i dstvec [32];
  __m128i atmp3;
  __m128i atmp2;
  __m128i atmp1;
  __m128i atmp0;
  __m128i mask;
  int i;
  int base;
  __m256i shift;
  __m256i res1;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m256i shift_1;
  __m256i res1_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  __m256i a1_2;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  __m128i *in_stack_ffffffffffffe550;
  uint in_stack_ffffffffffffe580;
  uint in_stack_ffffffffffffe584;
  undefined4 in_stack_ffffffffffffe588;
  uint in_stack_ffffffffffffe58c;
  uint in_stack_ffffffffffffe590;
  undefined4 in_stack_ffffffffffffe594;
  undefined4 in_stack_ffffffffffffe598;
  undefined2 in_stack_ffffffffffffe59c;
  ushort in_stack_ffffffffffffe59e;
  uint in_stack_ffffffffffffe5a0;
  int in_stack_ffffffffffffe5a4;
  undefined2 in_stack_ffffffffffffe5a8;
  undefined2 in_stack_ffffffffffffe5aa;
  undefined2 in_stack_ffffffffffffe5ac;
  ushort in_stack_ffffffffffffe5ae;
  ushort in_stack_ffffffffffffe5b0;
  undefined1 in_stack_ffffffffffffe5b2;
  undefined1 in_stack_ffffffffffffe5b3;
  int in_stack_ffffffffffffe5b4;
  undefined2 in_stack_ffffffffffffe5b8;
  undefined2 in_stack_ffffffffffffe5ba;
  ushort in_stack_ffffffffffffe5bc;
  ushort in_stack_ffffffffffffe5be;
  undefined2 in_stack_ffffffffffffe5c0;
  ushort in_stack_ffffffffffffe5c2;
  ushort in_stack_ffffffffffffe5c4;
  undefined2 in_stack_ffffffffffffe5c6;
  int local_1a38;
  int local_1a34;
  longlong local_1a30 [132];
  long local_1610;
  long local_1608;
  undefined1 local_1600 [16];
  undefined1 local_15f0 [16];
  undefined1 local_15e0 [16];
  undefined1 local_15d0 [16];
  undefined1 local_15c0 [16];
  int local_15a8;
  int local_15a4;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  int local_1508;
  uint local_1504;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [32];
  longlong local_1460;
  longlong lStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [16];
  undefined1 auStack_1430 [16];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [32];
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined1 auStack_13d0 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined1 auStack_13b0 [16];
  uint local_1388;
  int local_1384;
  byte local_137c;
  longlong *local_1370;
  undefined4 local_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  ushort local_12cc;
  ushort local_12ca;
  undefined2 local_12c8;
  ushort local_12c6;
  ushort local_12c4;
  undefined2 local_12c2;
  longlong local_12c0;
  longlong lStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  longlong local_12a0;
  longlong lStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  uint8_t local_1260 [8];
  uint8_t auStack_1258 [8];
  undefined8 local_1250;
  undefined8 uStack_1248;
  uint8_t local_1240 [8];
  uint8_t auStack_1238 [8];
  undefined8 local_1230;
  undefined8 uStack_1228;
  uint8_t local_1220 [8];
  uint8_t auStack_1218 [8];
  undefined8 local_1210;
  undefined8 uStack_1208;
  uint8_t local_1200 [8];
  uint8_t auStack_11f8 [8];
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [16];
  undefined1 auStack_11d0 [16];
  undefined2 local_11c0;
  undefined2 local_11be;
  undefined2 local_11bc;
  undefined2 local_11ba;
  undefined2 local_11b8;
  undefined2 local_11b6;
  undefined2 local_11b4;
  undefined2 local_11b2;
  undefined2 local_11b0;
  undefined2 local_11ae;
  undefined2 local_11ac;
  undefined2 local_11aa;
  undefined2 local_11a8;
  undefined2 local_11a6;
  undefined2 local_11a4;
  undefined2 local_11a2;
  undefined1 local_11a0 [16];
  undefined1 auStack_1190 [16];
  ushort local_1180;
  ushort local_117e;
  ushort local_117c;
  ushort local_117a;
  ushort local_1178;
  ushort local_1176;
  ushort local_1174;
  ushort local_1172;
  ushort local_1170;
  ushort local_116e;
  ushort local_116c;
  ushort local_116a;
  ushort local_1168;
  ushort local_1166;
  ushort local_1164;
  ushort local_1162;
  undefined1 local_1160 [16];
  undefined1 auStack_1150 [16];
  ushort local_1140;
  ushort local_113e;
  ushort local_113c;
  ushort local_113a;
  ushort local_1138;
  ushort local_1136;
  ushort local_1134;
  ushort local_1132;
  ushort local_1130;
  ushort local_112e;
  ushort local_112c;
  ushort local_112a;
  ushort local_1128;
  ushort local_1126;
  ushort local_1124;
  ushort local_1122;
  undefined1 local_1120 [32];
  undefined2 local_1100;
  undefined2 local_10fe;
  undefined2 local_10fc;
  undefined2 local_10fa;
  undefined2 local_10f8;
  undefined2 local_10f6;
  undefined2 local_10f4;
  undefined2 local_10f2;
  undefined2 local_10f0;
  undefined2 local_10ee;
  undefined2 local_10ec;
  undefined2 local_10ea;
  undefined2 local_10e8;
  undefined2 local_10e6;
  undefined2 local_10e4;
  undefined2 local_10e2;
  undefined1 local_10e0 [32];
  ushort local_10c0;
  ushort local_10be;
  ushort local_10bc;
  ushort local_10ba;
  ushort local_10b8;
  ushort local_10b6;
  ushort local_10b4;
  ushort local_10b2;
  ushort local_10b0;
  ushort local_10ae;
  ushort local_10ac;
  ushort local_10aa;
  ushort local_10a8;
  ushort local_10a6;
  ushort local_10a4;
  ushort local_10a2;
  undefined1 local_10a0 [32];
  ushort local_1080;
  ushort local_107e;
  ushort local_107c;
  ushort local_107a;
  ushort local_1078;
  ushort local_1076;
  ushort local_1074;
  ushort local_1072;
  ushort local_1070;
  ushort local_106e;
  ushort local_106c;
  ushort local_106a;
  ushort local_1068;
  ushort local_1066;
  ushort local_1064;
  ushort local_1062;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [16];
  undefined1 auStack_fd0 [16];
  undefined1 local_fc0 [16];
  undefined1 auStack_fb0 [16];
  undefined1 local_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined1 local_f80 [32];
  undefined1 (*local_f60) [16];
  undefined1 (*local_f58) [16];
  undefined1 (*local_f50) [16];
  undefined4 local_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined4 local_f04;
  undefined1 local_f00 [32];
  undefined4 local_ec4;
  undefined1 local_ec0 [32];
  undefined4 local_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined1 local_e40 [16];
  undefined1 auStack_e30 [16];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  int local_d68;
  uint local_d64;
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  int local_cc8;
  uint local_cc4;
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined1 auStack_c70 [16];
  undefined1 local_c60 [32];
  longlong local_c40;
  longlong lStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [32];
  undefined1 auStack_bd0 [16];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [24];
  undefined8 uStack_b68;
  uint local_b48;
  int local_b44;
  longlong *local_b30;
  undefined4 local_b28;
  ushort local_b22;
  longlong local_b20;
  longlong lStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  longlong local_ac0;
  longlong lStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  ushort local_a40;
  ushort local_a3e;
  ushort local_a3c;
  ushort local_a3a;
  ushort local_a38;
  ushort local_a36;
  ushort local_a34;
  ushort local_a32;
  ushort local_a30;
  ushort local_a2e;
  ushort local_a2c;
  ushort local_a2a;
  ushort local_a28;
  ushort local_a26;
  ushort local_a24;
  ushort local_a22;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 (*local_9a0) [16];
  undefined1 (*local_998) [16];
  undefined1 (*local_990) [16];
  undefined4 local_988;
  uint local_984;
  undefined4 local_980;
  uint local_97c;
  uint local_978;
  undefined4 local_974;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined1 local_880 [32];
  uint local_860;
  uint local_85c;
  uint local_858;
  uint local_854;
  uint local_850;
  uint local_84c;
  uint local_848;
  uint local_844;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  uint local_820;
  uint local_81c;
  uint local_818;
  uint local_814;
  uint local_810;
  uint local_80c;
  uint local_808;
  uint local_804;
  undefined1 local_800 [32];
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  uint local_7a0;
  uint local_79c;
  uint local_798;
  uint local_794;
  uint local_790;
  uint local_78c;
  uint local_788;
  uint local_784;
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_704;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined4 local_664;
  undefined1 local_660 [32];
  undefined4 local_624;
  undefined1 local_620 [32];
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint8_t local_3e0 [8];
  uint8_t auStack_3d8 [8];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint8_t local_3c0 [8];
  uint8_t auStack_3b8 [22];
  undefined1 local_3a2;
  undefined1 local_3a1;
  undefined2 local_3a0;
  undefined2 local_39e;
  undefined2 local_39c;
  undefined2 local_39a;
  undefined2 local_398;
  undefined2 local_396;
  undefined2 local_394;
  undefined2 local_392;
  ushort local_390;
  ushort local_38e;
  ushort local_38c;
  ushort local_38a;
  ushort local_388;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  ushort local_360;
  ushort local_35e;
  ushort local_35c;
  ushort local_35a;
  ushort local_358;
  ushort local_356;
  ushort local_354;
  ushort local_352;
  undefined2 local_350;
  undefined2 local_34e;
  undefined2 local_34c;
  undefined2 local_34a;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined2 local_340;
  undefined2 local_33e;
  undefined2 local_33c;
  undefined2 local_33a;
  undefined2 local_338;
  undefined2 local_336;
  undefined2 local_334;
  undefined2 local_332;
  ushort local_330;
  ushort local_32e;
  ushort local_32c;
  ushort local_32a;
  ushort local_328;
  ushort local_326;
  ushort local_324;
  ushort local_322;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  ushort local_300;
  ushort local_2fe;
  ushort local_2fc;
  ushort local_2fa;
  ushort local_2f8;
  ushort local_2f6;
  ushort local_2f4;
  ushort local_2f2;
  undefined2 local_2f0;
  undefined2 local_2ee;
  undefined2 local_2ec;
  undefined2 local_2ea;
  undefined2 local_2e8;
  undefined2 local_2e6;
  undefined2 local_2e4;
  undefined2 local_2e2;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  longlong local_240;
  longlong lStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  uint local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  uint local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  uint local_174;
  int local_170;
  int local_16c;
  int local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  int local_13c;
  int local_138;
  int local_134;
  uint local_130;
  int local_12c;
  int local_128;
  int local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 auStack_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar64._8_8_ = auStack_fd0._8_8_;
  auVar64._0_8_ = auStack_fd0._0_8_;
  auVar63._8_8_ = local_fe0._8_8_;
  auVar63._0_8_ = local_fe0._0_8_;
  auVar62._8_8_ = auStack_f90._8_8_;
  auVar62._0_8_ = auStack_f90._0_8_;
  auVar61._8_8_ = local_fa0._8_8_;
  auVar61._0_8_ = local_fa0._0_8_;
  auVar78._24_8_ = auStack_9d0._8_8_;
  auVar78._16_8_ = auStack_9d0._0_8_;
  auVar78._8_8_ = local_9e0._8_8_;
  auVar78._0_8_ = local_9e0._0_8_;
  auVar79._24_8_ = auStack_a10._8_8_;
  auVar79._16_8_ = auStack_a10._0_8_;
  auVar79._8_8_ = local_a20._8_8_;
  auVar79._0_8_ = local_a20._0_8_;
  auVar76._24_8_ = auStack_c70._8_8_;
  auVar76._16_8_ = auStack_c70._0_8_;
  auVar76._8_8_ = local_c80._8_8_;
  auVar76._0_8_ = local_c80._0_8_;
  auVar74._24_8_ = auStack_e30._8_8_;
  auVar74._16_8_ = auStack_e30._0_8_;
  auVar74._8_8_ = local_e40._8_8_;
  auVar74._0_8_ = local_e40._0_8_;
  auVar75._24_8_ = auStack_fb0._8_8_;
  auVar75._16_8_ = auStack_fb0._0_8_;
  auVar75._8_8_ = local_fc0._8_8_;
  auVar75._0_8_ = local_fc0._0_8_;
  auVar73._24_8_ = auStack_1430._8_8_;
  auVar73._16_8_ = auStack_1430._0_8_;
  auVar73._8_8_ = local_1440._8_8_;
  auVar73._0_8_ = local_1440._0_8_;
  local_137c = (byte)in_ECX;
  if (in_R9D < 0xc) {
    local_1364 = 0x20;
    plVar71 = local_1a30 + 0x40;
    iVar65 = 6 - in_ECX;
    uVar66 = 0x27 << (local_137c & 0x1f);
    local_12c2 = 0x10;
    in_stack_ffffffffffffe5c0 = 0x10;
    local_11a2 = 0x10;
    local_11a4 = 0x10;
    local_11a6 = 0x10;
    local_11a8 = 0x10;
    local_11aa = 0x10;
    local_11ac = 0x10;
    local_11ae = 0x10;
    local_11b0 = 0x10;
    local_11b2 = 0x10;
    local_11b4 = 0x10;
    local_11b6 = 0x10;
    local_11b8 = 0x10;
    local_11ba = 0x10;
    local_11bc = 0x10;
    local_11be = 0x10;
    local_11c0 = 0x10;
    auVar73._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,6);
    auVar2 = vpinsrw_avx(auVar73._0_16_,0x10,7);
    auVar73._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x10,6);
    auVar3 = vpinsrw_avx(auVar73._0_16_,0x10,7);
    local_11e0._0_8_ = auVar2._0_8_;
    local_11e0._8_8_ = auVar2._8_8_;
    auStack_11d0._0_8_ = auVar3._0_8_;
    auStack_11d0._8_8_ = auVar3._8_8_;
    local_1420 = local_11e0._0_8_;
    uStack_1418 = local_11e0._8_8_;
    uStack_1410 = auStack_11d0._0_8_;
    uStack_1408 = auStack_11d0._8_8_;
    in_stack_ffffffffffffe5c2 = *(ushort *)(in_RDX + (long)(int)uVar66 * 2);
    auVar73._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe5c2),(uint)in_stack_ffffffffffffe5c2,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,6);
    auVar4 = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,7);
    auVar73._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe5c2),(uint)in_stack_ffffffffffffe5c2,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,6);
    auVar5 = vpinsrw_avx(auVar73._0_16_,(uint)in_stack_ffffffffffffe5c2,7);
    local_11a0._0_8_ = auVar4._0_8_;
    local_11a0._8_8_ = auVar4._8_8_;
    auStack_1190._0_8_ = auVar5._0_8_;
    auStack_1190._8_8_ = auVar5._8_8_;
    local_1460 = local_11a0._0_8_;
    lStack_1458 = local_11a0._8_8_;
    uStack_1450 = auStack_1190._0_8_;
    uStack_1448 = auStack_1190._8_8_;
    local_1388._0_2_ = (ushort)uVar66;
    local_12c6 = (ushort)local_1388;
    local_1122 = (ushort)local_1388;
    local_1124 = (ushort)local_1388;
    local_1126 = (ushort)local_1388;
    local_1128 = (ushort)local_1388;
    local_112a = (ushort)local_1388;
    local_112c = (ushort)local_1388;
    local_112e = (ushort)local_1388;
    local_1130 = (ushort)local_1388;
    local_1132 = (ushort)local_1388;
    local_1134 = (ushort)local_1388;
    local_1136 = (ushort)local_1388;
    local_1138 = (ushort)local_1388;
    local_113a = (ushort)local_1388;
    local_113c = (ushort)local_1388;
    local_113e = (ushort)local_1388;
    local_1140 = (ushort)local_1388;
    auVar73._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1388),uVar66 & 0xffff,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,6);
    auVar6 = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,7);
    auVar73._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1388),uVar66 & 0xffff,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,6);
    auVar7 = vpinsrw_avx(auVar73._0_16_,uVar66 & 0xffff,7);
    local_1160._0_8_ = auVar6._0_8_;
    local_1160._8_8_ = auVar6._8_8_;
    auStack_1150._0_8_ = auVar7._0_8_;
    auStack_1150._8_8_ = auVar7._8_8_;
    local_14a0 = local_1160._0_8_;
    uStack_1498 = local_1160._8_8_;
    uStack_1490 = auStack_1150._0_8_;
    uStack_1488 = auStack_1150._8_8_;
    local_12c8 = 0x3f;
    in_stack_ffffffffffffe5c6 = 0x3f;
    local_10e2 = 0x3f;
    local_10e4 = 0x3f;
    local_10e6 = 0x3f;
    local_10e8 = 0x3f;
    local_10ea = 0x3f;
    local_10ec = 0x3f;
    local_10ee = 0x3f;
    local_10f0 = 0x3f;
    local_10f2 = 0x3f;
    local_10f4 = 0x3f;
    local_10f6 = 0x3f;
    local_10f8 = 0x3f;
    local_10fa = 0x3f;
    local_10fc = 0x3f;
    local_10fe = 0x3f;
    local_1100 = 0x3f;
    auVar73._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,6);
    auVar73._16_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,7);
    auVar73._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,2);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,3);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,4);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,5);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,6);
    auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0x3f,7);
    auVar73._0_16_ = ZEXT116(0) * auVar73._16_16_ + ZEXT116(1) * auVar73._0_16_;
    auVar73._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73._16_16_;
    local_1120._16_8_ = auVar73._16_8_;
    local_1120._24_8_ = auVar73._24_8_;
    local_1504 = in_R8D;
    for (local_1508 = 0; in_stack_ffffffffffffe5c4 = (ushort)local_1388, local_1384 = iVar65,
        local_1370 = plVar71, local_12c4 = in_stack_ffffffffffffe5c2,
        local_1180 = in_stack_ffffffffffffe5c2, local_117e = in_stack_ffffffffffffe5c2,
        local_117c = in_stack_ffffffffffffe5c2, local_117a = in_stack_ffffffffffffe5c2,
        local_1178 = in_stack_ffffffffffffe5c2, local_1176 = in_stack_ffffffffffffe5c2,
        local_1174 = in_stack_ffffffffffffe5c2, local_1172 = in_stack_ffffffffffffe5c2,
        local_1170 = in_stack_ffffffffffffe5c2, local_116e = in_stack_ffffffffffffe5c2,
        local_116c = in_stack_ffffffffffffe5c2, local_116a = in_stack_ffffffffffffe5c2,
        local_1168 = in_stack_ffffffffffffe5c2, local_1166 = in_stack_ffffffffffffe5c2,
        local_1164 = in_stack_ffffffffffffe5c2, local_1162 = in_stack_ffffffffffffe5c2,
        auVar13 = auVar73, auVar9 = auStack_a50, auVar80 = local_8c0, auVar1 = auStack_8b0,
        auVar10 = local_880, local_1508 < 0x20; local_1508 = local_1508 + 1) {
      iVar67 = (int)local_1504 >> ((byte)iVar65 & 0x1f);
      local_15a4 = iVar67;
      if ((int)uVar66 <= iVar67) {
        for (local_15a8 = local_1508; local_15a8 < 0x20; local_15a8 = local_15a8 + 1) {
          plVar71[(long)local_15a8 * 2] = local_11a0._0_8_;
          local_1a30[(long)local_15a8 * 2 + 0x41] = local_11a0._8_8_;
          local_12a0 = local_11a0._0_8_;
          lStack_1298 = local_11a0._8_8_;
          uStack_1290 = auStack_1190._0_8_;
          uStack_1288 = auStack_1190._8_8_;
        }
        break;
      }
      pauVar69 = (undefined1 (*) [16])(in_RDX + (long)iVar67 * 2);
      local_14f0 = *pauVar69;
      uVar16 = (ushort)iVar67;
      if (in_ECX == 0) {
        local_f60 = (undefined1 (*) [16])(in_RDX + 2 + (long)iVar67 * 2);
        local_1500 = *local_f60;
        local_324 = uVar16 + 1;
        local_326 = uVar16 + 2;
        local_328 = uVar16 + 3;
        local_32a = uVar16 + 4;
        local_32c = uVar16 + 5;
        local_32e = uVar16 + 6;
        local_330 = uVar16 + 7;
        local_332 = 0;
        local_334 = 0;
        local_336 = 0;
        local_338 = 0;
        local_33a = 0;
        local_33c = 0;
        local_33e = 0;
        local_340 = 0;
        in_stack_ffffffffffffe5aa = 0;
        in_stack_ffffffffffffe5ac = 0;
        local_2e2 = 0;
        local_2e4 = 0;
        local_2e6 = 0;
        local_2e8 = 0;
        local_2ea = 0;
        local_2ec = 0;
        local_2ee = 0;
        local_2f0 = 0;
        auVar75._0_16_ = vpinsrw_avx(ZEXT216(uVar16),(uint)local_324,1);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)local_326,2);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)local_328,3);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)local_32a,4);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)local_32c,5);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)local_32e,6);
        local_320 = vpinsrw_avx(auVar75._0_16_,(uint)local_330,7);
        auVar75._0_16_ = vpinsrw_avx(ZEXT216(0),0,1);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,0,2);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,0,3);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,0,4);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,0,5);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,0,6);
        auStack_310 = vpinsrw_avx(auVar75._0_16_,0,7);
        local_14c0 = local_320._0_8_;
        uStack_14b8 = local_320._8_8_;
        uStack_14b0 = auStack_310._0_8_;
        uStack_14a8 = auStack_310._8_8_;
        local_12cc = (ushort)local_1504;
        local_1062 = (ushort)local_1504;
        local_1064 = (ushort)local_1504;
        local_1066 = (ushort)local_1504;
        local_1068 = (ushort)local_1504;
        local_106a = (ushort)local_1504;
        local_106c = (ushort)local_1504;
        local_106e = (ushort)local_1504;
        local_1070 = (ushort)local_1504;
        local_1072 = (ushort)local_1504;
        local_1074 = (ushort)local_1504;
        local_1076 = (ushort)local_1504;
        local_1078 = (ushort)local_1504;
        local_107a = (ushort)local_1504;
        local_107c = (ushort)local_1504;
        local_107e = (ushort)local_1504;
        local_1080 = (ushort)local_1504;
        auVar75._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1504),local_1504 & 0xffff,1);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,2);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,3);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,4);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,5);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,6);
        auVar75._16_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,7);
        auVar75._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1504),local_1504 & 0xffff,1);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,2);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,3);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,4);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,5);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,6);
        auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,local_1504 & 0xffff,7);
        auVar75._0_16_ = ZEXT116(0) * auVar75._16_16_ + ZEXT116(1) * auVar75._0_16_;
        auVar75._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75._16_16_;
        local_10a0._16_8_ = auVar75._16_8_;
        local_10a0._24_8_ = auVar75._24_8_;
        auVar48._16_8_ = local_10a0._16_8_;
        auVar48._0_16_ = auVar75._0_16_;
        auVar48._24_8_ = local_10a0._24_8_;
        auVar47._16_8_ = local_1120._16_8_;
        auVar47._0_16_ = auVar73._0_16_;
        auVar47._24_8_ = local_1120._24_8_;
        local_f00 = vpand_avx2(auVar48,auVar47);
        local_f04 = 1;
        local_15a0 = vpsrlw_avx2(local_f00,ZEXT416(1));
        in_stack_ffffffffffffe5a4 = iVar67;
        in_stack_ffffffffffffe5ae = uVar16;
        in_stack_ffffffffffffe5b0 = (ushort)local_1504;
        local_10a0 = auVar75;
        local_322 = uVar16;
        local_300 = uVar16;
        local_2fe = local_324;
        local_2fc = local_326;
        local_2fa = local_328;
        local_2f8 = local_32a;
        local_2f6 = local_32c;
        local_2f4 = local_32e;
        local_2f2 = local_330;
        auVar63 = auVar73._0_16_;
        auVar64 = auVar73._16_16_;
      }
      else {
        local_f58 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)iVar67 * 2);
        local_1250 = *(undefined8 *)*local_f58;
        uStack_1248 = *(undefined8 *)(*local_f58 + 8);
        local_1200 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_11f8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar9._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar9._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_15d0 = vpshufb_avx(*pauVar69,auVar9);
        local_1220 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_1218 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar8._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar8._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_15e0 = vpshufb_avx(*local_f58,auVar8);
        local_1240 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_1238 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar1._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar1._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_15f0 = vpshufb_avx(*pauVar69,auVar1);
        local_1260 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_1258 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar80._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar80._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1600 = vpshufb_avx(*local_f58,auVar80);
        local_3a1 = 0xf;
        in_stack_ffffffffffffe5b2 = 0xf;
        local_201 = 0xf;
        local_202 = 0xf;
        local_203 = 0xf;
        local_204 = 0xf;
        local_205 = 0xf;
        local_206 = 0xf;
        local_207 = 0xf;
        local_208 = 0xf;
        local_209 = 0xf;
        local_20a = 0xf;
        local_20b = 0xf;
        local_20c = 0xf;
        local_20d = 0xf;
        local_20e = 0xf;
        local_20f = 0xf;
        local_210 = 0xf;
        auVar74._0_16_ = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,2);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,3);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,4);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,5);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,6);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,7);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,8);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,9);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,10);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xb);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xc);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xd);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xe);
        local_220 = vpinsrb_avx(auVar74._0_16_,0xf,0xf);
        local_3c0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_3b8._0_8_ = HighbdEvenOddMaskx[0]._8_8_;
        local_3d0 = local_220._0_8_;
        uStack_3c8 = local_220._8_8_;
        auVar54._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar54._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        auVar74._0_16_ = vpcmpgtb_avx(auVar54,local_220);
        local_15c0._0_8_ = auVar74._0_8_;
        local_15c0._8_8_ = auVar74._8_8_;
        local_d80 = local_15d0._0_8_;
        uStack_d78 = local_15d0._8_8_;
        local_d90 = local_15e0._0_8_;
        uStack_d88 = local_15e0._8_8_;
        local_da0 = local_15c0._0_8_;
        uStack_d98 = local_15c0._8_8_;
        local_14f0 = vpblendvb_avx(local_15d0,local_15e0,auVar74._0_16_);
        local_3a2 = 0xf;
        in_stack_ffffffffffffe5b3 = 0xf;
        local_1e1 = 0xf;
        local_1e2 = 0xf;
        local_1e3 = 0xf;
        local_1e4 = 0xf;
        local_1e5 = 0xf;
        local_1e6 = 0xf;
        local_1e7 = 0xf;
        local_1e8 = 0xf;
        local_1e9 = 0xf;
        local_1ea = 0xf;
        local_1eb = 0xf;
        local_1ec = 0xf;
        local_1ed = 0xf;
        local_1ee = 0xf;
        local_1ef = 0xf;
        local_1f0 = 0xf;
        auVar74._0_16_ = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,2);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,3);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,4);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,5);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,6);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,7);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,8);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,9);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,10);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xb);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xc);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xd);
        auVar74._0_16_ = vpinsrb_avx(auVar74._0_16_,0xf,0xe);
        local_200 = vpinsrb_avx(auVar74._0_16_,0xf,0xf);
        local_3e0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_3d8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        local_3f0 = local_200._0_8_;
        uStack_3e8 = local_200._8_8_;
        auVar53._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar53._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_15c0 = vpcmpgtb_avx(auVar53,local_200);
        local_db0 = local_15f0._0_8_;
        uStack_da8 = local_15f0._8_8_;
        local_dc0 = local_1600._0_8_;
        uStack_db8 = local_1600._8_8_;
        local_dd0 = local_15c0._0_8_;
        uStack_dc8 = local_15c0._8_8_;
        local_1500 = vpblendvb_avx(local_15f0,local_1600,local_15c0);
        local_384 = uVar16 + 2;
        local_386 = uVar16 + 4;
        local_388 = uVar16 + 6;
        local_38a = uVar16 + 8;
        local_38c = uVar16 + 10;
        local_38e = uVar16 + 0xc;
        local_390 = uVar16 + 0xe;
        local_392 = 0;
        local_394 = 0;
        local_396 = 0;
        local_398 = 0;
        local_39a = 0;
        local_39c = 0;
        local_39e = 0;
        local_3a0 = 0;
        in_stack_ffffffffffffe5b8 = 0;
        in_stack_ffffffffffffe5ba = 0;
        local_342 = 0;
        local_344 = 0;
        local_346 = 0;
        local_348 = 0;
        local_34a = 0;
        local_34c = 0;
        local_34e = 0;
        local_350 = 0;
        auVar74._0_16_ = vpinsrw_avx(ZEXT216(uVar16),(uint)local_384,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_386,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_388,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_38a,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_38c,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_38e,6);
        local_380 = vpinsrw_avx(auVar74._0_16_,(uint)local_390,7);
        auVar74._0_16_ = vpinsrw_avx(ZEXT216(0),0,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,6);
        auStack_370 = vpinsrw_avx(auVar74._0_16_,0,7);
        local_14c0 = local_380._0_8_;
        uStack_14b8 = local_380._8_8_;
        uStack_14b0 = auStack_370._0_8_;
        uStack_14a8 = auStack_370._8_8_;
        local_12ca = (ushort)local_1504;
        local_10a2 = (ushort)local_1504;
        local_10a4 = (ushort)local_1504;
        local_10a6 = (ushort)local_1504;
        local_10a8 = (ushort)local_1504;
        local_10aa = (ushort)local_1504;
        local_10ac = (ushort)local_1504;
        local_10ae = (ushort)local_1504;
        local_10b0 = (ushort)local_1504;
        local_10b2 = (ushort)local_1504;
        local_10b4 = (ushort)local_1504;
        local_10b6 = (ushort)local_1504;
        local_10b8 = (ushort)local_1504;
        local_10ba = (ushort)local_1504;
        local_10bc = (ushort)local_1504;
        local_10be = (ushort)local_1504;
        local_10c0 = (ushort)local_1504;
        auVar74._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1504),local_1504 & 0xffff,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,6);
        auVar74._16_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,7);
        auVar74._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1504),local_1504 & 0xffff,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,6);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1504 & 0xffff,7);
        auVar74._0_16_ = ZEXT116(0) * auVar74._16_16_ + ZEXT116(1) * auVar74._0_16_;
        auVar74._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74._16_16_;
        local_10e0._16_8_ = auVar74._16_8_;
        local_10e0._24_8_ = auVar74._24_8_;
        auVar51._16_8_ = local_10e0._16_8_;
        auVar51._0_16_ = auVar74._0_16_;
        auVar51._24_8_ = local_10e0._24_8_;
        local_f80 = vpsllw_avx2(auVar51,ZEXT416(in_ECX));
        auVar49._16_8_ = local_1120._16_8_;
        auVar49._0_16_ = auVar73._0_16_;
        auVar49._24_8_ = local_1120._24_8_;
        local_ec0 = vpand_avx2(local_f80,auVar49);
        local_ec4 = 1;
        local_15a0 = vpsrlw_avx2(local_ec0,ZEXT416(1));
        in_stack_ffffffffffffe5b4 = iVar67;
        in_stack_ffffffffffffe5bc = uVar16;
        in_stack_ffffffffffffe5be = (ushort)local_1504;
        local_1230 = *(undefined8 *)*pauVar69;
        uStack_1228 = *(undefined8 *)(*pauVar69 + 8);
        local_1210 = local_1250;
        uStack_1208 = uStack_1248;
        local_11f0 = *(undefined8 *)*pauVar69;
        uStack_11e8 = *(undefined8 *)(*pauVar69 + 8);
        local_10e0 = auVar74;
        local_382 = uVar16;
        local_360 = uVar16;
        local_35e = local_384;
        local_35c = local_386;
        local_35a = local_388;
        local_358 = local_38a;
        local_356 = local_38c;
        local_354 = local_38e;
        local_352 = local_390;
        auVar61 = auVar73._0_16_;
        auVar62 = auVar73._16_16_;
      }
      auVar80 = ZEXT416(1);
      auStack_13d0._0_8_ = auVar80._0_8_;
      uVar26 = auStack_13d0._0_8_;
      auVar44._16_8_ = auStack_13d0._0_8_;
      auVar44._0_16_ = local_1500;
      auVar44._24_8_ = 0;
      auVar43._16_8_ = auStack_13d0._0_8_;
      auVar43._0_16_ = local_14f0;
      auVar43._24_8_ = 0;
      auVar15 = vpsubw_avx2(auVar44,auVar43);
      local_e84 = 5;
      auVar50._16_8_ = auStack_13d0._0_8_;
      auVar50._0_16_ = local_14f0;
      auVar50._24_8_ = 0;
      auVar13 = vpsllw_avx2(auVar50,ZEXT416(5));
      local_1400._0_8_ = auVar13._0_8_;
      uVar27 = local_1400._0_8_;
      local_1400._8_8_ = auVar13._8_8_;
      uVar17 = local_1400._8_8_;
      local_1400._16_8_ = auVar13._16_8_;
      uVar18 = local_1400._16_8_;
      local_1400._24_8_ = auVar13._24_8_;
      uVar19 = local_1400._24_8_;
      auVar42._16_8_ = auStack_11d0._0_8_;
      auVar42._0_16_ = auVar2;
      auVar42._24_8_ = auStack_11d0._8_8_;
      auVar13 = vpaddw_avx2(auVar13,auVar42);
      local_1480._0_8_ = auVar15._0_8_;
      uVar20 = local_1480._0_8_;
      local_1480._8_8_ = auVar15._8_8_;
      uVar21 = local_1480._8_8_;
      local_1480._16_8_ = auVar15._16_8_;
      uVar22 = local_1480._16_8_;
      local_1480._24_8_ = auVar15._24_8_;
      uVar23 = local_1480._24_8_;
      auVar12 = vpmullw_avx2(auVar15,local_15a0);
      local_1400._0_8_ = auVar13._0_8_;
      uVar24 = local_1400._0_8_;
      local_1400._8_8_ = auVar13._8_8_;
      uVar28 = local_1400._8_8_;
      local_1400._16_8_ = auVar13._16_8_;
      uVar29 = local_1400._16_8_;
      local_1400._24_8_ = auVar13._24_8_;
      uVar30 = local_1400._24_8_;
      local_1540._0_8_ = auVar12._0_8_;
      uVar31 = local_1540._0_8_;
      local_1540._8_8_ = auVar12._8_8_;
      uVar32 = local_1540._8_8_;
      local_1540._16_8_ = auVar12._16_8_;
      uVar33 = local_1540._16_8_;
      local_1540._24_8_ = auVar12._24_8_;
      uVar34 = local_1540._24_8_;
      auVar10 = vpaddw_avx2(auVar13,auVar12);
      local_1560._0_8_ = auVar10._0_8_;
      uVar35 = local_1560._0_8_;
      local_1560._8_8_ = auVar10._8_8_;
      uVar36 = local_1560._8_8_;
      local_1560._16_8_ = auVar10._16_8_;
      uVar37 = local_1560._16_8_;
      local_1560._24_8_ = auVar10._24_8_;
      uVar38 = local_1560._24_8_;
      local_f44 = 5;
      auVar14 = vpsrlw_avx2(auVar10,ZEXT416(5));
      auVar46._16_8_ = auStack_1150._0_8_;
      auVar46._0_16_ = auVar6;
      auVar46._24_8_ = auStack_1150._8_8_;
      auVar45._8_8_ = uStack_14b8;
      auVar45._0_8_ = local_14c0;
      auVar45._16_8_ = uStack_14b0;
      auVar45._24_8_ = uStack_14a8;
      auVar11 = vpcmpgtw_avx2(auVar46,auVar45);
      local_240 = local_11a0._0_8_;
      lStack_238 = local_11a0._8_8_;
      uStack_230 = auStack_1190._0_8_;
      uStack_228 = auStack_1190._8_8_;
      local_1560._0_8_ = auVar14._0_8_;
      local_260 = local_1560._0_8_;
      local_1560._8_8_ = auVar14._8_8_;
      uStack_258 = local_1560._8_8_;
      local_1560._16_8_ = auVar14._16_8_;
      uStack_250 = local_1560._16_8_;
      local_1560._24_8_ = auVar14._24_8_;
      uStack_248 = local_1560._24_8_;
      local_14e0._0_8_ = auVar11._0_8_;
      local_280 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar11._8_8_;
      uStack_278 = local_14e0._8_8_;
      local_14e0._16_8_ = auVar11._16_8_;
      uStack_270 = local_14e0._16_8_;
      local_14e0._24_8_ = auVar11._24_8_;
      uStack_268 = local_14e0._24_8_;
      auVar56._16_8_ = auStack_1190._0_8_;
      auVar56._0_16_ = auVar4;
      auVar56._24_8_ = auStack_1190._8_8_;
      auVar10 = vpblendvb_avx2(auVar56,auVar14,auVar11);
      local_1580._0_8_ = auVar10._0_8_;
      lVar25 = local_1580._0_8_;
      local_1580._8_8_ = auVar10._8_8_;
      lVar39 = local_1580._8_8_;
      local_1580._16_8_ = auVar10._16_8_;
      uVar40 = local_1580._16_8_;
      local_1580._24_8_ = auVar10._24_8_;
      uVar41 = local_1580._24_8_;
      plVar71[(long)local_1508 * 2] = local_1580._0_8_;
      local_1a30[(long)local_1508 * 2 + 0x41] = local_1580._8_8_;
      local_1504 = in_R8D + local_1504;
      local_1580 = auVar10;
      local_1560 = auVar14;
      local_1540 = auVar12;
      local_14e0 = auVar11;
      local_1480 = auVar15;
      local_1400 = auVar13;
      local_13e0 = local_1500._0_8_;
      uStack_13d8 = local_1500._8_8_;
      auStack_13d0 = auVar80;
      local_13c0 = local_14f0._0_8_;
      uStack_13b8 = local_14f0._8_8_;
      auStack_13b0 = auVar80;
      local_1360 = uVar31;
      uStack_1358 = uVar32;
      uStack_1350 = uVar33;
      uStack_1348 = uVar34;
      local_1340 = uVar24;
      uStack_1338 = uVar28;
      uStack_1330 = uVar29;
      uStack_1328 = uVar30;
      local_1320 = local_11e0._0_8_;
      uStack_1318 = local_11e0._8_8_;
      uStack_1310 = auStack_11d0._0_8_;
      uStack_1308 = auStack_11d0._8_8_;
      local_1300 = uVar27;
      uStack_12f8 = uVar17;
      uStack_12f0 = uVar18;
      uStack_12e8 = uVar19;
      local_12c0 = lVar25;
      lStack_12b8 = lVar39;
      uStack_12b0 = uVar40;
      uStack_12a8 = uVar41;
      local_1280 = local_1500._0_8_;
      uStack_1278 = local_1500._8_8_;
      local_1270 = local_14f0._0_8_;
      uStack_1268 = local_14f0._8_8_;
      local_1060 = local_14f0._0_8_;
      uStack_1058 = local_14f0._8_8_;
      uStack_1050 = uVar26;
      uStack_1048 = 0;
      local_1040 = local_1500._0_8_;
      uStack_1038 = local_1500._8_8_;
      uStack_1030 = uVar26;
      uStack_1028 = 0;
      local_1020 = local_14c0;
      uStack_1018 = uStack_14b8;
      uStack_1010 = uStack_14b0;
      uStack_1008 = uStack_14a8;
      local_1000 = local_1160._0_8_;
      uStack_ff8 = local_1160._8_8_;
      uStack_ff0 = auStack_1150._0_8_;
      uStack_fe8 = auStack_1150._8_8_;
      local_f50 = pauVar69;
      local_f40 = uVar35;
      uStack_f38 = uVar36;
      uStack_f30 = uVar37;
      uStack_f28 = uVar38;
      local_e80 = local_14f0._0_8_;
      uStack_e78 = local_14f0._8_8_;
      uStack_e70 = uVar26;
      uStack_e68 = 0;
      local_e20 = local_15a0._0_8_;
      uStack_e18 = local_15a0._8_8_;
      uStack_e10 = local_15a0._16_8_;
      uStack_e08 = local_15a0._24_8_;
      local_e00 = uVar20;
      uStack_df8 = uVar21;
      uStack_df0 = uVar22;
      uStack_de8 = uVar23;
    }
  }
  else {
    local_b28 = 0x20;
    plVar71 = local_1a30 + 0x40;
    iVar65 = 6 - in_ECX;
    in_stack_ffffffffffffe5a0 = 0x27 << (local_137c & 0x1f);
    local_974 = 0x10;
    in_stack_ffffffffffffe598 = 0x10;
    local_884 = 0x10;
    local_888 = 0x10;
    local_88c = 0x10;
    local_890 = 0x10;
    local_894 = 0x10;
    local_898 = 0x10;
    local_89c = 0x10;
    local_8a0 = 0x10;
    auVar76._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar76._0_16_ = vpinsrd_avx(auVar76._0_16_,0x10,2);
    auVar80 = vpinsrd_avx(auVar76._0_16_,0x10,3);
    auVar76._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar76._0_16_ = vpinsrd_avx(auVar76._0_16_,0x10,2);
    auVar1 = vpinsrd_avx(auVar76._0_16_,0x10,3);
    local_8c0._0_8_ = auVar80._0_8_;
    local_8c0._8_8_ = auVar80._8_8_;
    auStack_8b0._0_8_ = auVar1._0_8_;
    auStack_8b0._8_8_ = auVar1._8_8_;
    local_c20 = local_8c0._0_8_;
    uStack_c18 = local_8c0._8_8_;
    uStack_c10 = auStack_8b0._0_8_;
    uStack_c08 = auStack_8b0._8_8_;
    in_stack_ffffffffffffe59e = *(ushort *)(in_RDX + (long)(int)in_stack_ffffffffffffe5a0 * 2);
    auVar76._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe59e),(uint)in_stack_ffffffffffffe59e,1);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,2);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,3);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,4);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,5);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,6);
    auVar8 = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,7);
    auVar76._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe59e),(uint)in_stack_ffffffffffffe59e,1);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,2);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,3);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,4);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,5);
    auVar76._0_16_ = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,6);
    auVar9 = vpinsrw_avx(auVar76._0_16_,(uint)in_stack_ffffffffffffe59e,7);
    local_a60._0_8_ = auVar8._0_8_;
    uVar26 = local_a60._0_8_;
    local_a60._8_8_ = auVar8._8_8_;
    uVar27 = local_a60._8_8_;
    auStack_a50._0_8_ = auVar9._0_8_;
    auStack_a50._8_8_ = auVar9._8_8_;
    local_c40 = local_a60._0_8_;
    lStack_c38 = local_a60._8_8_;
    uStack_c30 = auStack_a50._0_8_;
    uStack_c28 = auStack_a50._8_8_;
    auVar76._0_16_ = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe5a0),in_stack_ffffffffffffe5a0,1);
    auVar76._0_16_ = vpinsrd_avx(auVar76._0_16_,in_stack_ffffffffffffe5a0,2);
    auVar76._16_16_ = vpinsrd_avx(auVar76._0_16_,in_stack_ffffffffffffe5a0,3);
    auVar76._0_16_ = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe5a0),in_stack_ffffffffffffe5a0,1);
    auVar76._0_16_ = vpinsrd_avx(auVar76._0_16_,in_stack_ffffffffffffe5a0,2);
    auVar76._0_16_ = vpinsrd_avx(auVar76._0_16_,in_stack_ffffffffffffe5a0,3);
    auVar76._0_16_ = ZEXT116(0) * auVar76._16_16_ + ZEXT116(1) * auVar76._0_16_;
    auVar76._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar76._16_16_;
    local_880._16_8_ = auVar76._16_8_;
    local_880._24_8_ = auVar76._24_8_;
    local_cc4 = in_R8D;
    local_a60 = auVar8;
    for (local_cc8 = 0; uVar66 = local_1388, auVar2 = local_11e0, auVar3 = auStack_11d0,
        auVar4 = local_11a0, auVar5 = auStack_1190, auVar6 = local_1160, auVar7 = auStack_1150,
        auVar13 = local_1120, local_b48 = in_stack_ffffffffffffe5a0, local_b44 = iVar65,
        local_b30 = plVar71, local_b22 = in_stack_ffffffffffffe59e,
        local_a40 = in_stack_ffffffffffffe59e, local_a3e = in_stack_ffffffffffffe59e,
        local_a3c = in_stack_ffffffffffffe59e, local_a3a = in_stack_ffffffffffffe59e,
        local_a38 = in_stack_ffffffffffffe59e, local_a36 = in_stack_ffffffffffffe59e,
        local_a34 = in_stack_ffffffffffffe59e, local_a32 = in_stack_ffffffffffffe59e,
        local_a30 = in_stack_ffffffffffffe59e, local_a2e = in_stack_ffffffffffffe59e,
        local_a2c = in_stack_ffffffffffffe59e, local_a2a = in_stack_ffffffffffffe59e,
        local_a28 = in_stack_ffffffffffffe59e, local_a26 = in_stack_ffffffffffffe59e,
        local_a24 = in_stack_ffffffffffffe59e, local_a22 = in_stack_ffffffffffffe59e,
        local_978 = in_stack_ffffffffffffe5a0, auVar10 = auVar76,
        local_860 = in_stack_ffffffffffffe5a0, local_85c = in_stack_ffffffffffffe5a0,
        local_858 = in_stack_ffffffffffffe5a0, local_854 = in_stack_ffffffffffffe5a0,
        local_850 = in_stack_ffffffffffffe5a0, local_84c = in_stack_ffffffffffffe5a0,
        local_848 = in_stack_ffffffffffffe5a0, local_844 = in_stack_ffffffffffffe5a0,
        local_cc8 < 0x20; local_cc8 = local_cc8 + 1) {
      uVar68 = (int)local_cc4 >> ((byte)iVar65 & 0x1f);
      local_d64 = uVar68;
      if ((int)in_stack_ffffffffffffe5a0 <= (int)uVar68) {
        for (local_d68 = local_cc8; local_d68 < 0x20; local_d68 = local_d68 + 1) {
          plVar71[(long)local_d68 * 2] = uVar26;
          local_1a30[(long)local_d68 * 2 + 0x41] = uVar27;
          local_ac0 = uVar26;
          lStack_ab8 = uVar27;
          uStack_ab0 = auStack_a50._0_8_;
          uStack_aa8 = auStack_a50._8_8_;
        }
        break;
      }
      pauVar69 = (undefined1 (*) [16])(in_RDX + (long)(int)uVar68 * 2);
      uVar17 = *(undefined8 *)*pauVar69;
      uVar18 = *(undefined8 *)(*pauVar69 + 8);
      auVar13 = vpmovzxwd_avx2(*pauVar69);
      lVar72 = in_RDX + (long)(int)uVar68 * 2;
      pauVar70 = (undefined1 (*) [16])(lVar72 + 2);
      uVar19 = *(undefined8 *)*pauVar70;
      uVar20 = *(undefined8 *)(lVar72 + 10);
      local_ba0 = vpmovzxwd_avx2(*pauVar70);
      if (in_ECX == 0) {
        local_168 = uVar68 + 1;
        local_16c = uVar68 + 2;
        local_170 = uVar68 + 3;
        local_174 = uVar68 + 4;
        local_178 = uVar68 + 5;
        local_17c = uVar68 + 6;
        local_180 = uVar68 + 7;
        auVar79._0_16_ = vpinsrd_avx(ZEXT416(uVar68),local_168,1);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,local_16c,2);
        local_160 = vpinsrd_avx(auVar79._0_16_,local_170,3);
        auVar79._0_16_ = vpinsrd_avx(ZEXT416(local_174),local_178,1);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,local_17c,2);
        auStack_150 = vpinsrd_avx(auVar79._0_16_,local_180,3);
        local_ca0 = local_160._0_8_;
        uStack_c98 = local_160._8_8_;
        uStack_c90 = auStack_150._0_8_;
        uStack_c88 = auStack_150._8_8_;
        local_984 = local_cc4;
        local_784 = local_cc4;
        local_788 = local_cc4;
        local_78c = local_cc4;
        local_790 = local_cc4;
        local_794 = local_cc4;
        local_798 = local_cc4;
        local_79c = local_cc4;
        local_7a0 = local_cc4;
        auVar79._0_16_ = vpinsrd_avx(ZEXT416(local_cc4),local_cc4,1);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,local_cc4,2);
        local_7c0 = vpinsrd_avx(auVar79._0_16_,local_cc4,3);
        auVar79._0_16_ = vpinsrd_avx(ZEXT416(local_cc4),local_cc4,1);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,local_cc4,2);
        auStack_7b0 = vpinsrd_avx(auVar79._0_16_,local_cc4,3);
        local_988 = 0x3f;
        in_stack_ffffffffffffe588 = 0x3f;
        local_744 = 0x3f;
        local_748 = 0x3f;
        local_74c = 0x3f;
        local_750 = 0x3f;
        local_754 = 0x3f;
        local_758 = 0x3f;
        local_75c = 0x3f;
        local_760 = 0x3f;
        auVar79._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,0x3f,2);
        auVar79._16_16_ = vpinsrd_avx(auVar79._0_16_,0x3f,3);
        auVar79._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,0x3f,2);
        auVar79._0_16_ = vpinsrd_avx(auVar79._0_16_,0x3f,3);
        auVar79._0_16_ = ZEXT116(0) * auVar79._16_16_ + ZEXT116(1) * auVar79._0_16_;
        auVar79._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar79._16_16_;
        local_780._16_8_ = auVar79._16_8_;
        local_780._24_8_ = auVar79._24_8_;
        local_a00 = local_7c0._0_8_;
        uStack_9f8 = local_7c0._8_8_;
        uStack_9f0 = auStack_7b0._0_8_;
        uStack_9e8 = auStack_7b0._8_8_;
        auVar11._16_8_ = auStack_7b0._0_8_;
        auVar11._0_16_ = local_7c0;
        auVar11._24_8_ = auStack_7b0._8_8_;
        auVar10._16_8_ = local_780._16_8_;
        auVar10._0_16_ = auVar79._0_16_;
        auVar10._24_8_ = local_780._24_8_;
        local_660 = vpand_avx2(auVar11,auVar10);
        local_664 = 1;
        local_d60 = vpsrld_avx2(local_660,ZEXT416(1));
        in_stack_ffffffffffffe580 = uVar68;
        in_stack_ffffffffffffe584 = local_cc4;
        _local_b80 = auVar13;
        local_780 = auVar79;
        local_164 = uVar68;
        local_140 = uVar68;
        local_13c = local_168;
        local_138 = local_16c;
        local_134 = local_170;
        local_130 = local_174;
        local_12c = local_178;
        local_128 = local_17c;
        local_124 = local_180;
      }
      else {
        local_b80._0_8_ = auVar13._0_8_;
        local_b80._8_8_ = auVar13._8_8_;
        local_b80._16_8_ = auVar13._16_8_;
        uStack_b68 = auVar13._24_8_;
        local_6a8 = 7;
        local_6ac = 5;
        local_6b0 = 3;
        local_6b4 = 1;
        local_6b8 = 6;
        local_6bc = 4;
        local_6c0 = 2;
        local_6c4 = 0;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,4,2);
        local_700 = vpinsrd_avx(auVar78._0_16_,6,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,5,2);
        auStack_6f0 = vpinsrd_avx(auVar78._0_16_,7,3);
        local_8e0 = local_b80._0_8_;
        uStack_8d8 = local_b80._8_8_;
        uStack_8d0 = local_b80._16_8_;
        uStack_8c8 = uStack_b68;
        local_900 = local_700._0_8_;
        uStack_8f8 = local_700._8_8_;
        uStack_8f0 = auStack_6f0._0_8_;
        uStack_8e8 = auStack_6f0._8_8_;
        auVar14._16_8_ = auStack_6f0._0_8_;
        auVar14._0_16_ = local_700;
        auVar14._24_8_ = auStack_6f0._8_8_;
        auVar10 = vpermd_avx2(auVar14,auVar13);
        stack0xfffffffffffff490 = auVar10._16_16_;
        local_a60 = stack0xfffffffffffff490;
        auStack_bd0 = auVar13._0_16_;
        local_ba0._8_8_ = uStack_a68;
        local_ba0._0_8_ = local_a70;
        local_9a0 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)(int)uVar68 * 2);
        local_970 = *(undefined8 *)*local_9a0;
        uStack_968 = *(undefined8 *)(*local_9a0 + 8);
        auVar13 = vpmovzxwd_avx2(*local_9a0);
        local_bc0._0_8_ = auVar13._0_8_;
        local_bc0._8_8_ = auVar13._8_8_;
        local_bc0._16_8_ = auVar13._16_8_;
        local_bc0._24_8_ = auVar13._24_8_;
        local_704 = 7;
        local_708 = 5;
        local_70c = 3;
        local_710 = 1;
        local_714 = 6;
        local_718 = 4;
        local_71c = 2;
        local_720 = 0;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,4,2);
        local_740 = vpinsrd_avx(auVar78._0_16_,6,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,5,2);
        auStack_730 = vpinsrd_avx(auVar78._0_16_,7,3);
        local_920 = local_bc0._0_8_;
        uStack_918 = local_bc0._8_8_;
        uStack_910 = local_bc0._16_8_;
        uStack_908 = local_bc0._24_8_;
        local_940 = local_740._0_8_;
        uStack_938 = local_740._8_8_;
        uStack_930 = auStack_730._0_8_;
        uStack_928 = auStack_730._8_8_;
        auVar12._16_8_ = auStack_730._0_8_;
        auVar12._0_16_ = local_740;
        auVar12._24_8_ = auStack_730._8_8_;
        local_bc0 = vpermd_avx2(auVar12,auVar13);
        uStack_a68 = local_bc0._24_8_;
        local_a70 = local_bc0._16_8_;
        local_ae0 = local_bc0._0_8_;
        uStack_ad8 = local_bc0._8_8_;
        uStack_ad0 = local_bc0._16_8_;
        uStack_ac8 = local_bc0._24_8_;
        auVar77._0_16_ = ZEXT116(0) * local_bc0._0_16_ + ZEXT116(1) * auVar10._0_16_;
        auVar77._16_16_ = ZEXT116(0) * stack0xfffffffffffff490 + ZEXT116(1) * local_bc0._0_16_;
        uStack_af0 = local_b80._0_8_;
        uStack_ae8 = local_b80._8_8_;
        auVar2._8_8_ = uStack_a78;
        auVar2._0_8_ = local_a80;
        local_ba0._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * local_ba0._0_16_;
        local_ba0._16_16_ = ZEXT116(0) * auStack_bd0 + ZEXT116(1) * auVar2;
        local_1c8 = uVar68 + 2;
        local_1cc = uVar68 + 4;
        local_1d0 = uVar68 + 6;
        local_1d4 = uVar68 + 8;
        local_1d8 = uVar68 + 10;
        local_1dc = uVar68 + 0xc;
        local_1e0 = uVar68 + 0xe;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(uVar68),local_1c8,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_1cc,2);
        local_1c0 = vpinsrd_avx(auVar78._0_16_,local_1d0,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_1d4),local_1d8,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_1dc,2);
        auStack_1b0 = vpinsrd_avx(auVar78._0_16_,local_1e0,3);
        local_ca0 = local_1c0._0_8_;
        uStack_c98 = local_1c0._8_8_;
        uStack_c90 = auStack_1b0._0_8_;
        uStack_c88 = auStack_1b0._8_8_;
        local_97c = local_cc4;
        local_804 = local_cc4;
        local_808 = local_cc4;
        local_80c = local_cc4;
        local_810 = local_cc4;
        local_814 = local_cc4;
        local_818 = local_cc4;
        local_81c = local_cc4;
        local_820 = local_cc4;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_cc4),local_cc4,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_cc4,2);
        local_840 = vpinsrd_avx(auVar78._0_16_,local_cc4,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_cc4),local_cc4,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_cc4,2);
        auStack_830 = vpinsrd_avx(auVar78._0_16_,local_cc4,3);
        local_5a0 = local_840._0_8_;
        uStack_598 = local_840._8_8_;
        uStack_590 = auStack_830._0_8_;
        uStack_588 = auStack_830._8_8_;
        auVar15._16_8_ = auStack_830._0_8_;
        auVar15._0_16_ = local_840;
        auVar15._24_8_ = auStack_830._8_8_;
        local_9c0 = vpslld_avx2(auVar15,ZEXT416(in_ECX));
        local_980 = 0x3f;
        in_stack_ffffffffffffe594 = 0x3f;
        local_7c4 = 0x3f;
        local_7c8 = 0x3f;
        local_7cc = 0x3f;
        local_7d0 = 0x3f;
        local_7d4 = 0x3f;
        local_7d8 = 0x3f;
        local_7dc = 0x3f;
        local_7e0 = 0x3f;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,2);
        auVar78._16_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,2);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,3);
        auVar78._0_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar78._0_16_;
        auVar78._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar78._16_16_;
        local_800._16_8_ = auVar78._16_8_;
        local_800._24_8_ = auVar78._24_8_;
        auVar13._16_8_ = local_800._16_8_;
        auVar13._0_16_ = auVar78._0_16_;
        auVar13._24_8_ = local_800._24_8_;
        local_620 = vpand_avx2(local_9c0,auVar13);
        local_624 = 1;
        local_d60 = vpsrld_avx2(local_620,ZEXT416(1));
        in_stack_ffffffffffffe58c = uVar68;
        in_stack_ffffffffffffe590 = local_cc4;
        _local_b80 = auVar77;
        local_800 = auVar78;
        local_1c4 = uVar68;
        local_1a0 = uVar68;
        local_19c = local_1c8;
        local_198 = local_1cc;
        local_194 = local_1d0;
        local_190 = local_1d4;
        local_18c = local_1d8;
        local_188 = local_1dc;
        local_184 = local_1e0;
      }
      local_560 = local_ba0._0_8_;
      uStack_558 = local_ba0._8_8_;
      uStack_550 = local_ba0._16_8_;
      uStack_548 = local_ba0._24_8_;
      local_580 = local_b80._0_8_;
      uStack_578 = local_b80._8_8_;
      uStack_570 = local_b80._16_8_;
      uStack_568 = uStack_b68;
      auVar15 = vpsubd_avx2(local_ba0,_local_b80);
      local_5e0 = local_b80._0_8_;
      uStack_5d8 = local_b80._8_8_;
      uStack_5d0 = local_b80._16_8_;
      uStack_5c8 = uStack_b68;
      local_5e4 = 5;
      auVar13 = vpslld_avx2(_local_b80,ZEXT416(5));
      local_c00._0_8_ = auVar13._0_8_;
      local_4e0 = local_c00._0_8_;
      local_c00._8_8_ = auVar13._8_8_;
      uStack_4d8 = local_c00._8_8_;
      local_c00._16_8_ = auVar13._16_8_;
      uStack_4d0 = local_c00._16_8_;
      local_c00._24_8_ = auVar13._24_8_;
      uStack_4c8 = local_c00._24_8_;
      local_500 = local_8c0._0_8_;
      uStack_4f8 = local_8c0._8_8_;
      uStack_4f0 = auStack_8b0._0_8_;
      uStack_4e8 = auStack_8b0._8_8_;
      auVar52._16_8_ = auStack_8b0._0_8_;
      auVar52._0_16_ = auVar80;
      auVar52._24_8_ = auStack_8b0._8_8_;
      auVar11 = vpaddd_avx2(auVar13,auVar52);
      local_c60._0_8_ = auVar15._0_8_;
      local_4a0 = local_c60._0_8_;
      local_c60._8_8_ = auVar15._8_8_;
      uStack_498 = local_c60._8_8_;
      local_c60._16_8_ = auVar15._16_8_;
      uStack_490 = local_c60._16_8_;
      local_c60._24_8_ = auVar15._24_8_;
      uStack_488 = local_c60._24_8_;
      local_4c0 = local_d60._0_8_;
      uStack_4b8 = local_d60._8_8_;
      uStack_4b0 = local_d60._16_8_;
      uStack_4a8 = local_d60._24_8_;
      auVar12 = vpmulld_avx2(auVar15,local_d60);
      local_c00._0_8_ = auVar11._0_8_;
      local_520 = local_c00._0_8_;
      local_c00._8_8_ = auVar11._8_8_;
      uStack_518 = local_c00._8_8_;
      local_c00._16_8_ = auVar11._16_8_;
      uStack_510 = local_c00._16_8_;
      local_c00._24_8_ = auVar11._24_8_;
      uStack_508 = local_c00._24_8_;
      local_d00._0_8_ = auVar12._0_8_;
      local_540 = local_d00._0_8_;
      local_d00._8_8_ = auVar12._8_8_;
      uStack_538 = local_d00._8_8_;
      local_d00._16_8_ = auVar12._16_8_;
      uStack_530 = local_d00._16_8_;
      local_d00._24_8_ = auVar12._24_8_;
      uStack_528 = local_d00._24_8_;
      auVar13 = vpaddd_avx2(auVar11,auVar12);
      local_d20._0_8_ = auVar13._0_8_;
      local_6a0 = local_d20._0_8_;
      local_d20._8_8_ = auVar13._8_8_;
      uStack_698 = local_d20._8_8_;
      local_d20._16_8_ = auVar13._16_8_;
      uStack_690 = local_d20._16_8_;
      local_d20._24_8_ = auVar13._24_8_;
      uStack_688 = local_d20._24_8_;
      local_6a4 = 5;
      auStack_110 = ZEXT416(5);
      auVar14 = vpsrld_avx2(auVar13,auStack_110);
      local_d20._0_8_ = auVar14._0_8_;
      local_100 = local_d20._0_8_;
      local_d20._8_8_ = auVar14._8_8_;
      uStack_f8 = local_d20._8_8_;
      local_d20._16_8_ = auVar14._16_8_;
      uStack_f0 = local_d20._16_8_;
      local_d20._24_8_ = auVar14._24_8_;
      uStack_e8 = local_d20._24_8_;
      uVar21 = local_d20._16_8_;
      uVar22 = local_d20._24_8_;
      local_120 = local_d20._16_8_;
      uStack_118 = local_d20._24_8_;
      auVar57._16_16_ = auStack_110;
      auVar57._0_16_ = auVar14._16_16_;
      auVar10 = vpackusdw_avx2(auVar14,auVar57);
      uStack_b0 = local_880._16_8_;
      uStack_a8 = local_880._24_8_;
      local_e0 = local_ca0;
      uStack_d8 = uStack_c98;
      uStack_d0 = uStack_c90;
      uStack_c8 = uStack_c88;
      auVar59._16_8_ = local_880._16_8_;
      auVar59._0_16_ = auVar76._0_16_;
      auVar59._24_8_ = local_880._24_8_;
      auVar58._8_8_ = uStack_c98;
      auVar58._0_8_ = local_ca0;
      auVar58._16_8_ = uStack_c90;
      auVar58._24_8_ = uStack_c88;
      auVar13 = vpcmpgtd_avx2(auVar59,auVar58);
      local_cc0._0_8_ = auVar13._0_8_;
      local_80 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar13._8_8_;
      uStack_78 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar13._16_8_;
      uStack_70 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar13._24_8_;
      uStack_68 = local_cc0._24_8_;
      uVar23 = local_cc0._16_8_;
      uVar24 = local_cc0._24_8_;
      local_a0 = local_cc0._16_8_;
      uStack_98 = local_cc0._24_8_;
      auStack_90 = ZEXT416(5);
      auVar60._16_16_ = auStack_90;
      auVar60._0_16_ = auVar13._16_16_;
      auVar13 = vpackssdw_avx2(auVar13,auVar60);
      local_2a0 = uVar26;
      lStack_298 = uVar27;
      uStack_290 = auStack_a50._0_8_;
      uStack_288 = auStack_a50._8_8_;
      local_d40._0_8_ = auVar10._0_8_;
      local_2c0 = local_d40._0_8_;
      local_d40._8_8_ = auVar10._8_8_;
      uStack_2b8 = local_d40._8_8_;
      local_d40._16_8_ = auVar10._16_8_;
      uStack_2b0 = local_d40._16_8_;
      local_d40._24_8_ = auVar10._24_8_;
      uStack_2a8 = local_d40._24_8_;
      local_cc0._0_8_ = auVar13._0_8_;
      local_2e0 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar13._8_8_;
      uStack_2d8 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar13._16_8_;
      uStack_2d0 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar13._24_8_;
      uStack_2c8 = local_cc0._24_8_;
      auVar55._16_8_ = auStack_a50._0_8_;
      auVar55._0_16_ = auVar8;
      auVar55._24_8_ = auStack_a50._8_8_;
      auVar10 = vpblendvb_avx2(auVar55,auVar10,auVar13);
      local_d40._0_8_ = auVar10._0_8_;
      lVar25 = local_d40._0_8_;
      local_d40._8_8_ = auVar10._8_8_;
      lVar39 = local_d40._8_8_;
      local_d40._16_8_ = auVar10._16_8_;
      uVar28 = local_d40._16_8_;
      local_d40._24_8_ = auVar10._24_8_;
      uVar29 = local_d40._24_8_;
      plVar71[(long)local_cc8 * 2] = local_d40._0_8_;
      local_1a30[(long)local_cc8 * 2 + 0x41] = local_d40._8_8_;
      local_cc4 = in_R8D + local_cc4;
      local_d40 = auVar10;
      local_d20 = auVar14;
      local_d00 = auVar12;
      local_cc0 = auVar13;
      local_c60 = auVar15;
      local_c00 = auVar11;
      local_b20 = lVar25;
      lStack_b18 = lVar39;
      uStack_b10 = uVar28;
      uStack_b08 = uVar29;
      local_aa0 = uVar23;
      uStack_a98 = uVar24;
      local_a90 = uVar21;
      uStack_a88 = uVar22;
      local_998 = pauVar70;
      local_990 = pauVar69;
      local_960 = uVar19;
      uStack_958 = uVar20;
      local_950 = uVar17;
      uStack_948 = uVar18;
      local_c0 = auVar76._0_16_;
    }
  }
  local_880 = auVar10;
  auStack_8b0 = auVar1;
  local_8c0 = auVar80;
  auStack_a50 = auVar9;
  local_1120 = auVar13;
  auStack_1150 = auVar7;
  local_1160 = auVar6;
  auStack_1190 = auVar5;
  local_11a0 = auVar4;
  auStack_11d0 = auVar3;
  local_11e0 = auVar2;
  local_1388 = uVar66;
  local_1610 = in_RSI;
  local_1608 = in_RDI;
  local_fa0 = auVar61;
  auStack_f90 = auVar62;
  local_fe0 = auVar63;
  auStack_fd0 = auVar64;
  for (local_1a34 = 0; local_1a34 < 0x20; local_1a34 = local_1a34 + 8) {
    local_1440 = auVar73._0_16_;
    auStack_1430 = auVar73._16_16_;
    local_c80 = auVar76._0_16_;
    auStack_c70 = auVar76._16_16_;
    local_fc0 = auVar75._0_16_;
    auStack_fb0 = auVar75._16_16_;
    local_e40 = auVar74._0_16_;
    auStack_e30 = auVar74._16_16_;
    local_a20 = auVar79._0_16_;
    auStack_a10 = auVar79._16_16_;
    local_9e0 = auVar78._0_16_;
    auStack_9d0 = auVar78._16_16_;
    highbd_transpose8x8_sse2
              (in_stack_ffffffffffffe550,(__m128i *)(local_1a30 + (long)(local_1a34 + 7) * 2),
               (__m128i *)(local_1a30 + (long)(local_1a34 + 6) * 2),
               (__m128i *)(local_1a30 + (long)(local_1a34 + 5) * 2),
               (__m128i *)(local_1a30 + (long)(local_1a34 + 4) * 2),
               (__m128i *)(local_1a30 + (long)(local_1a34 + 3) * 2),
               (__m128i *)(local_1a30 + (long)(local_1a34 + 7) * 2),
               (__m128i *)CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580),
               (__m128i *)CONCAT44(in_stack_ffffffffffffe58c,in_stack_ffffffffffffe588),
               (__m128i *)CONCAT44(in_stack_ffffffffffffe594,in_stack_ffffffffffffe590),
               (__m128i *)
               CONCAT26(in_stack_ffffffffffffe59e,
                        CONCAT24(in_stack_ffffffffffffe59c,in_stack_ffffffffffffe598)),
               (__m128i *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
               (__m128i *)
               CONCAT26(in_stack_ffffffffffffe5ae,
                        CONCAT24(in_stack_ffffffffffffe5ac,
                                 CONCAT22(in_stack_ffffffffffffe5aa,in_stack_ffffffffffffe5a8))),
               (__m128i *)
               CONCAT44(in_stack_ffffffffffffe5b4,
                        CONCAT13(in_stack_ffffffffffffe5b3,
                                 CONCAT12(in_stack_ffffffffffffe5b2,in_stack_ffffffffffffe5b0))),
               (__m128i *)
               CONCAT26(in_stack_ffffffffffffe5be,
                        CONCAT24(in_stack_ffffffffffffe5bc,
                                 CONCAT22(in_stack_ffffffffffffe5ba,in_stack_ffffffffffffe5b8))),
               (__m128i *)
               CONCAT26(in_stack_ffffffffffffe5c6,
                        CONCAT24(in_stack_ffffffffffffe5c4,
                                 CONCAT22(in_stack_ffffffffffffe5c2,in_stack_ffffffffffffe5c0))));
    auVar73._0_16_ = local_1440;
    auVar73._16_16_ = auStack_1430;
    auVar76._0_16_ = local_c80;
    auVar76._16_16_ = auStack_c70;
    auVar75._0_16_ = local_fc0;
    auVar75._16_16_ = auStack_fb0;
    auVar74._0_16_ = local_e40;
    auVar74._16_16_ = auStack_e30;
    auVar79._0_16_ = local_a20;
    auVar79._16_16_ = auStack_a10;
    auVar78._0_16_ = local_9e0;
    auVar78._16_16_ = auStack_9d0;
  }
  for (local_1a38 = 0; local_1a38 < 8; local_1a38 = local_1a38 + 1) {
    plVar71 = (longlong *)(local_1608 + local_1a38 * local_1610 * 2);
    lVar25 = local_1a30[(long)local_1a38 * 2 + 1];
    *plVar71 = local_1a30[(long)local_1a38 * 2];
    plVar71[1] = lVar25;
    lVar72 = local_1608 + local_1a38 * local_1610 * 2;
    lVar25 = local_1a30[(long)(local_1a38 + 8) * 2 + 1];
    *(longlong *)(lVar72 + 0x10) = local_1a30[(long)(local_1a38 + 8) * 2];
    *(longlong *)(lVar72 + 0x18) = lVar25;
    lVar72 = local_1608 + local_1a38 * local_1610 * 2;
    lVar25 = local_1a30[(long)(local_1a38 + 0x10) * 2 + 1];
    *(longlong *)(lVar72 + 0x20) = local_1a30[(long)(local_1a38 + 0x10) * 2];
    *(longlong *)(lVar72 + 0x28) = lVar25;
    lVar72 = local_1608 + local_1a38 * local_1610 * 2;
    lVar25 = local_1a30[(long)(local_1a38 + 0x18) * 2 + 1];
    *(longlong *)(lVar72 + 0x30) = local_1a30[(long)(local_1a38 + 0x18) * 2];
    *(longlong *)(lVar72 + 0x38) = lVar25;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z3_32x8_avx2(uint16_t *dst, ptrdiff_t stride,
                                              const uint16_t *left,
                                              int upsample_left, int dy,
                                              int bd) {
  __m128i dstvec[32], d[32];
  if (bd < 12) {
    highbd_dr_prediction_z1_8xN_internal_avx2(32, dstvec, left, upsample_left,
                                              dy);
  } else {
    highbd_dr_prediction_32bit_z1_8xN_internal_avx2(32, dstvec, left,
                                                    upsample_left, dy);
  }

  for (int i = 0; i < 32; i += 8) {
    highbd_transpose8x8_sse2(&dstvec[0 + i], &dstvec[1 + i], &dstvec[2 + i],
                             &dstvec[3 + i], &dstvec[4 + i], &dstvec[5 + i],
                             &dstvec[6 + i], &dstvec[7 + i], &d[0 + i],
                             &d[1 + i], &d[2 + i], &d[3 + i], &d[4 + i],
                             &d[5 + i], &d[6 + i], &d[7 + i]);
  }
  for (int i = 0; i < 8; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride), d[i]);
    _mm_storeu_si128((__m128i *)(dst + i * stride + 8), d[i + 8]);
    _mm_storeu_si128((__m128i *)(dst + i * stride + 16), d[i + 16]);
    _mm_storeu_si128((__m128i *)(dst + i * stride + 24), d[i + 24]);
  }
}